

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall IMLE::set_internal_parameters(IMLE *this)

{
  X *xpr;
  Z *xpr_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  Index index;
  ulong uVar10;
  long lVar11;
  plainobjectbase_evaluator_data<double,_0> *ppVar12;
  char *pcVar13;
  ActualDstType actualDst;
  double dVar14;
  Scalar SVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  double __tmp;
  Scal SVar19;
  double degrees_of_freedom;
  policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  local_49;
  plainobjectbase_evaluator_data<double,_0> local_48;
  plainobjectbase_evaluator_data<double,_0> local_40;
  Scal local_38;
  plainobjectbase_evaluator_data<double,_0> local_30;
  Scalar local_28;
  
  iVar8 = (int)((ulong)((long)(this->experts).
                              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                              .
                              super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->experts).
                             super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             .
                             super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x5f02a3a1;
  this->M = iVar8;
  if (iVar8 == 0) {
    SVar19 = (this->param).sigma0;
    if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != (long)this->d) {
      local_38 = SVar19;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)this->d,1);
      SVar19 = local_38;
    }
    auVar7 = _DAT_0018b020;
    auVar6 = _DAT_0018b010;
    lVar11 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (0 < lVar11) {
      pdVar3 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar9 = lVar11 + 0x1fffffffffffffff;
      uVar10 = uVar9 & 0x1fffffffffffffff;
      auVar16._8_4_ = (int)uVar10;
      auVar16._0_8_ = uVar10;
      auVar16._12_4_ = (int)(uVar10 >> 0x20);
      lVar11 = 0;
      auVar16 = auVar16 ^ _DAT_0018b020;
      do {
        auVar17._8_4_ = (int)lVar11;
        auVar17._0_8_ = lVar11;
        auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar17 = (auVar17 | auVar6) ^ auVar7;
        bVar5 = auVar16._0_4_ < auVar17._0_4_;
        iVar8 = auVar16._4_4_;
        iVar18 = auVar17._4_4_;
        if ((bool)(~(iVar8 < iVar18 || iVar18 == iVar8 && bVar5) & 1)) {
          pdVar3[lVar11] = SVar19;
        }
        if (iVar8 >= iVar18 && (iVar18 != iVar8 || !bVar5)) {
          pdVar3[lVar11 + 1] = SVar19;
        }
        lVar11 = lVar11 + 2;
      } while ((uVar10 - ((uint)uVar9 & 1)) + 2 != lVar11);
    }
    pdVar3 = (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar11 = (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != lVar11) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar11,
                 1);
    }
    pdVar4 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar9 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    uVar10 = uVar9 - ((long)uVar9 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar9) {
      lVar11 = 0;
      do {
        pdVar1 = pdVar3 + lVar11;
        dVar14 = pdVar1[1];
        pdVar2 = pdVar4 + lVar11;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar14;
        lVar11 = lVar11 + 2;
      } while (lVar11 < (long)uVar10);
    }
    if ((long)uVar10 < (long)uVar9) {
      do {
        pdVar4[uVar10] = pdVar3[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
  }
  local_48.data = (double *)(double)this->D;
  if (0x3fe < (uint)((ulong)((long)ABS((double)local_48.data) + -0x10000000000000) >> 0x35) ||
      (long)local_48.data < 0) {
    boost::math::policies::detail::raise_error<std::domain_error,double>
              ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
               "Degrees of freedom argument is %1%, but must be > 0 !",(double *)&local_48);
  }
  local_30.data = (double *)(1.0 - (this->param).p0);
  local_40.data = local_48.data;
  if ((long)local_48.data - 1U < 0xfffffffffffff ||
      -1 < (long)local_48.data &&
      (uint)((long)ABS((double)local_48.data) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    if (0x7fefffffffffffff < (long)ABS((double)local_30.data) ||
        ((double)local_30.data < 0.0 || 1.0 < (double)local_30.data)) {
      pcVar13 = "Probability argument is %1%, but must be >= 0 and <= 1 !";
      ppVar12 = &local_30;
      goto LAB_0014686c;
    }
    dVar14 = boost::math::detail::
             gamma_p_inv_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                       ((double)local_48.data * 0.5,(double)local_30.data,&local_49);
    dVar14 = (dVar14 + dVar14) * -0.5;
  }
  else {
    pcVar13 = "Degrees of freedom argument is %1%, but must be > 0 !";
    ppVar12 = &local_40;
LAB_0014686c:
    boost::math::policies::detail::raise_error<std::domain_error,double>
              (boost::math::
               quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
               ::function,pcVar13,(double *)ppVar12);
    dVar14 = NAN;
  }
  dVar14 = exp(dVar14);
  this->sig_level_noiseX_rbf = dVar14;
  local_48.data = (double *)(double)this->d;
  if (0x3fe < (uint)((ulong)((long)ABS((double)local_48.data) + -0x10000000000000) >> 0x35) ||
      (long)local_48.data < 0) {
    boost::math::policies::detail::raise_error<std::domain_error,double>
              ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
               "Degrees of freedom argument is %1%, but must be > 0 !",(double *)&local_48);
  }
  local_30.data = (double *)(1.0 - (this->param).p0);
  local_40.data = local_48.data;
  if ((long)local_48.data - 1U < 0xfffffffffffff ||
      -1 < (long)local_48.data &&
      (uint)((long)ABS((double)local_48.data) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    if (0x7fefffffffffffff < (long)ABS((double)local_30.data) ||
        ((double)local_30.data < 0.0 || 1.0 < (double)local_30.data)) {
      pcVar13 = "Probability argument is %1%, but must be >= 0 and <= 1 !";
      ppVar12 = &local_30;
      goto LAB_001469a3;
    }
    dVar14 = boost::math::detail::
             gamma_p_inv_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                       ((double)local_48.data * 0.5,(double)local_30.data,&local_49);
    dVar14 = (dVar14 + dVar14) * -0.5;
  }
  else {
    pcVar13 = "Degrees of freedom argument is %1%, but must be > 0 !";
    ppVar12 = &local_40;
LAB_001469a3:
    boost::math::policies::detail::raise_error<std::domain_error,double>
              (boost::math::
               quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
               ::function,pcVar13,(double *)ppVar12);
    dVar14 = NAN;
  }
  dVar14 = exp(dVar14);
  this->sig_level_noiseZ_rbf = dVar14;
  local_48.data = (double *)(double)(this->d + this->D);
  if (0x3fe < (uint)((ulong)((long)ABS((double)local_48.data) + -0x10000000000000) >> 0x35) ||
      (long)local_48.data < 0) {
    boost::math::policies::detail::raise_error<std::domain_error,double>
              ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
               "Degrees of freedom argument is %1%, but must be > 0 !",(double *)&local_48);
  }
  local_30.data = (double *)(1.0 - (this->param).p0);
  local_40.data = local_48.data;
  if ((long)local_48.data - 1U < 0xfffffffffffff ||
      -1 < (long)local_48.data &&
      (uint)(((ulong)local_48.data & 0x7fffffffffffffff) + 0xfff0000000000000 >> 0x35) < 0x3ff) {
    if ((long)ABS((double)local_30.data) < 0x7ff0000000000000 &&
        (0.0 <= (double)local_30.data && (double)local_30.data <= 1.0)) {
      dVar14 = boost::math::detail::
               gamma_p_inv_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                         ((double)local_48.data * 0.5,(double)local_30.data,&local_49);
      dVar14 = (dVar14 + dVar14) * -0.5;
      goto LAB_00146b08;
    }
    pcVar13 = "Probability argument is %1%, but must be >= 0 and <= 1 !";
    ppVar12 = &local_30;
  }
  else {
    pcVar13 = "Degrees of freedom argument is %1%, but must be > 0 !";
    ppVar12 = &local_40;
  }
  boost::math::policies::detail::raise_error<std::domain_error,double>
            (boost::math::
             quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
             ::function,pcVar13,(double *)ppVar12);
  dVar14 = NAN;
LAB_00146b08:
  dVar14 = exp(dVar14);
  this->sig_level_noiseZX_rbf = dVar14;
  local_38 = this->sig_level_noiseX_rbf;
  xpr = &this->Psi;
  dVar14 = 1.0;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      0) {
    local_40.data =
         (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar14 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_40,
                        (scalar_product_op<double,_double> *)&local_48,xpr);
  }
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  this->pNoiseModelX = local_38 / dVar14;
  local_38 = this->sig_level_noiseZ_rbf;
  xpr_00 = &this->Sigma;
  if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    dVar14 = 1.0;
  }
  else {
    local_40.data =
         (xpr_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar14 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_40,
                        (scalar_product_op<double,_double> *)&local_48,xpr_00);
  }
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  this->pNoiseModelZ = local_38 / dVar14;
  local_38 = this->sig_level_noiseZX_rbf;
  SVar15 = 1.0;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      0) {
    local_40.data =
         (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar15 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_40,
                        (scalar_product_op<double,_double> *)&local_48,xpr);
  }
  dVar14 = 1.0;
  if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 0) {
    local_40.data =
         (xpr_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_28 = SVar15;
    dVar14 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_40,
                        (scalar_product_op<double,_double> *)&local_48,xpr_00);
    SVar15 = local_28;
  }
  dVar14 = SVar15 * dVar14;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  this->pNoiseModelZX = local_38 / dVar14;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::set_internal_parameters()
{
    // Number of experts
    M = experts.size();

    // Initial guess for hyperparameters
    if( M == 0 )
    {
        Sigma = Z::Constant(d,param.sigma0);  //Template: Z::Constant(param.sigma0)
        Psi = param.Psi0;
    }

    // Significance test level
    sig_level_noiseX_rbf = exp(-0.5* quantile(boost::math::chi_squared(D), 1.0 - param.p0) );
    sig_level_noiseZ_rbf = exp(-0.5* quantile(boost::math::chi_squared(d), 1.0 - param.p0) );
    sig_level_noiseZX_rbf = exp(-0.5* quantile(boost::math::chi_squared(D+d), 1.0 - param.p0) );

    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf/ sqrt(Psi.prod() * Sigma.prod());
}